

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Type __thiscall wasm::TranslateToFuzzReader::getTupleType(TranslateToFuzzReader *this)

{
  byte bVar1;
  Index IVar2;
  size_type sVar3;
  value_type local_60;
  value_type local_58;
  Type type;
  size_t i;
  size_t maxElements;
  vector<wasm::Type,_std::allocator<wasm::Type>_> elements;
  TranslateToFuzzReader *this_local;
  
  elements.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&maxElements);
  IVar2 = upTo(this,(this->fuzzParams->super_FuzzParams).MAX_TUPLE_SIZE - 1);
  for (type.id = 0; type.id < IVar2 + 2; type.id = type.id + 1) {
    local_58.id = (uintptr_t)getSingleConcreteType(this);
    bVar1 = ::wasm::Type::isDefaultable();
    if ((bVar1 & 1) != 0) {
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&maxElements,&local_58);
    }
  }
  while (sVar3 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::size
                           ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&maxElements),
        sVar3 < 2) {
    local_60.id = (uintptr_t)getMVPType(this);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&maxElements,&local_60);
  }
  ::wasm::Type::Type((Type *)&this_local,(vector *)&maxElements);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&maxElements);
  return (Type)(uintptr_t)this_local;
}

Assistant:

Type TranslateToFuzzReader::getTupleType() {
  std::vector<Type> elements;
  size_t maxElements = 2 + upTo(fuzzParams->MAX_TUPLE_SIZE - 1);
  for (size_t i = 0; i < maxElements; ++i) {
    auto type = getSingleConcreteType();
    // Don't add a non-defaultable type into a tuple, as currently we can't
    // spill them into locals (that would require a "let").
    if (type.isDefaultable()) {
      elements.push_back(type);
    }
  }
  while (elements.size() < 2) {
    elements.push_back(getMVPType());
  }
  return Type(elements);
}